

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_batchnorm_scale(NetOptimize *this)

{
  int iVar1;
  Layer *pLVar2;
  int *piVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  ulong local_48;
  
  uVar13 = (ulong)((long)(this->super_Net).layers.
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar12 = (int)uVar13;
  uVar10 = 0;
  if (0 < iVar12) {
    uVar10 = uVar13 & 0xffffffff;
  }
  local_48 = 1;
  uVar13 = 0;
  do {
    if (uVar13 == uVar10) {
      return 0;
    }
    bVar9 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar13]->type,"BatchNorm");
    if (!bVar9) {
      iVar1 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar14 = local_48; (int)uVar14 < iVar12; uVar14 = uVar14 + 1) {
        bVar9 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"Scale");
        if (((!bVar9) &&
            (pLVar2 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14],
            piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar3 == 4)) && (*piVar3 == iVar1)) {
          if ((int)uVar14 != iVar12) {
            ppLVar4 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar2 = ppLVar4[uVar13];
            pLVar5 = ppLVar4[uVar14 & 0xffffffff];
            fprintf(_stderr,"fuse_batchnorm_scale %s %s\n",(pLVar2->name)._M_dataplus._M_p,
                    (pLVar5->name)._M_dataplus._M_p);
            lVar6 = *(long *)&pLVar2[1].one_blob_only;
            lVar7 = *(long *)((long)&pLVar2[2].name.field_2 + 8);
            uVar14 = (ulong)*(uint *)&pLVar2[1]._vptr_Layer;
            if ((int)*(uint *)&pLVar2[1]._vptr_Layer < 1) {
              uVar14 = 0;
            }
            for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
              lVar8 = *(long *)&pLVar5[1].one_blob_only;
              *(float *)(lVar6 + uVar11 * 4) =
                   *(float *)(lVar8 + uVar11 * 4) * *(float *)(lVar6 + uVar11 * 4);
              fVar15 = *(float *)(lVar8 + uVar11 * 4) * *(float *)(lVar7 + uVar11 * 4);
              if (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) != 0) {
                fVar15 = fVar15 + *(float *)(*(long *)((long)&pLVar5[1].name.field_2 + 8) +
                                            uVar11 * 4);
              }
              *(float *)(lVar7 + uVar11 * 4) = fVar15;
            }
            iVar1 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
            (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar1].producer = (int)uVar13;
            std::__cxx11::string::assign((char *)&pLVar5->type);
          }
          break;
        }
      }
    }
    uVar13 = uVar13 + 1;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_batchnorm_scale()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "BatchNorm")
            continue;

        // BatchNorm - Scale
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Scale")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse BatchNorm - Scale to BatchNorm
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[i];
        ncnn::Scale* scale = (ncnn::Scale*)layers[j];

        fprintf(stderr, "fuse_batchnorm_scale %s %s\n", batchnorm->name.c_str(), scale->name.c_str());

        {
//             v = ((v - mean) / sqrt(var + eps) * slope + bias) * s + b
//               =  (v - mean) / sqrt(var + eps) * (slope * s) + (bias * s + b)

            int channels = batchnorm->channels;

            float* slope = batchnorm->slope_data;
            float* bias = batchnorm->bias_data;

            for (int q=0; q<channels; q++)
            {
                slope[q] = slope[q] * scale->scale_data[q];
                if (scale->bias_term)
                    bias[q] = bias[q] * scale->scale_data[q] + scale->bias_data[q];
                else
                    bias[q] = bias[q] * scale->scale_data[q];
            }
        }

        int top_blob_index_final = scale->tops[0];
        batchnorm->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        scale->type = "ncnnfused";
    }

    return 0;
}